

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::GroupNorm_x86_fma::forward_inplace(GroupNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  long lVar14;
  uint uVar15;
  undefined1 (*pauVar16) [32];
  long lVar17;
  undefined1 (*pauVar18) [32];
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uint *puVar25;
  __m128 x64;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar149;
  undefined1 auVar144 [16];
  float fVar153;
  undefined1 auVar145 [32];
  float fVar147;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [64];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar143 [32];
  
  auVar3 = _DAT_0060f7a0;
  auVar2 = _DAT_0060f780;
  iVar8 = bottom_top_blob->dims;
  uVar19 = (long)(this->super_GroupNorm).channels / (long)(this->super_GroupNorm).group;
  uVar23 = uVar19 & 0xffffffff;
  uVar6 = (uint)uVar19;
  auVar108 = in_ZMM6._0_16_;
  if (iVar8 == 2) {
    if (0 < (this->super_GroupNorm).group) {
      uVar7 = bottom_top_blob->w;
      uVar15 = uVar7 * uVar6;
      uVar9 = uVar15 & 0xfffffff8;
      lVar14 = 0;
      auVar106._8_8_ = 0x8000000000000000;
      auVar106._0_8_ = 0x8000000000000000;
      auVar108 = vpcmpeqd_avx(auVar108,auVar108);
      do {
        lVar17 = lVar14 * (int)uVar6;
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar129 = 0.0;
        fVar130 = 0.0;
        fVar121 = 0.0;
        fVar128 = 0.0;
        fVar131 = 0.0;
        fVar132 = 0.0;
        fVar133 = 0.0;
        fVar134 = 0.0;
        pauVar13 = pauVar16;
        uVar11 = 0;
        fVar147 = 0.0;
        fVar148 = 0.0;
        fVar149 = 0.0;
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar152 = 0.0;
        fVar153 = 0.0;
        fVar135 = 0.0;
        if (7 < (int)uVar15) {
          iVar8 = 7;
          do {
            fVar121 = fVar121 + *(float *)*pauVar13;
            fVar128 = fVar128 + *(float *)(*pauVar13 + 4);
            fVar129 = fVar129 + *(float *)(*pauVar13 + 8);
            fVar130 = fVar130 + *(float *)(*pauVar13 + 0xc);
            fVar131 = fVar131 + *(float *)(*pauVar13 + 0x10);
            fVar132 = fVar132 + *(float *)(*pauVar13 + 0x14);
            fVar133 = fVar133 + *(float *)(*pauVar13 + 0x18);
            fVar134 = fVar134 + *(float *)(*pauVar13 + 0x1c);
            pauVar13 = pauVar13 + 1;
            iVar8 = iVar8 + 8;
            uVar11 = uVar9;
            fVar147 = fVar121;
            fVar148 = fVar128;
            fVar149 = fVar129;
            fVar150 = fVar130;
            fVar151 = fVar131;
            fVar152 = fVar132;
            fVar153 = fVar133;
            fVar135 = fVar134;
          } while (iVar8 < (int)uVar15);
        }
        uVar10 = uVar11 | 3;
        auVar138 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar129 = auVar138._4_4_;
          fVar130 = auVar138._8_4_;
          fVar121 = auVar138._12_4_;
          if ((int)uVar15 <= (int)uVar10) break;
          auVar138._0_4_ = auVar138._0_4_ + *(float *)*pauVar13;
          auVar138._4_4_ = fVar129 + *(float *)(*pauVar13 + 4);
          auVar138._8_4_ = fVar130 + *(float *)(*pauVar13 + 8);
          auVar138._12_4_ = fVar121 + *(float *)(*pauVar13 + 0xc);
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          uVar10 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        auVar37._0_4_ = fVar147 + fVar151;
        auVar37._4_4_ = fVar148 + fVar152;
        auVar37._8_4_ = fVar149 + fVar153;
        auVar37._12_4_ = fVar150 + fVar135;
        auVar39 = vshufpd_avx(auVar37,auVar37,1);
        auVar38._0_4_ = auVar39._0_4_ + auVar37._0_4_;
        auVar38._4_4_ = auVar39._4_4_ + auVar37._4_4_;
        auVar38._8_4_ = auVar39._8_4_ + auVar37._8_4_;
        auVar38._12_4_ = auVar39._12_4_ + auVar37._12_4_;
        auVar39 = vshufpd_avx(auVar138,auVar138,1);
        auVar95._0_4_ = auVar138._0_4_ + auVar39._0_4_;
        auVar95._4_4_ = fVar129 + auVar39._4_4_;
        auVar95._8_4_ = fVar130 + auVar39._8_4_;
        auVar95._12_4_ = fVar121 + auVar39._12_4_;
        auVar138 = vhaddps_avx(auVar38,auVar38);
        auVar39 = vmovshdup_avx(auVar95);
        fVar129 = auVar138._0_4_ + auVar39._0_4_ + auVar95._0_4_;
        if ((int)uVar11 < (int)uVar15) {
          uVar19 = CONCAT44(0,~uVar11 + uVar15);
          auVar138 = vblendps_avx(ZEXT416((uint)fVar129),_DAT_0060b0c0,0xe);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar19;
          auVar38 = vpshufd_avx(auVar39,0x44);
          auVar39 = vorps_avx(auVar38,auVar106);
          auVar37 = vorps_avx(auVar38,auVar106);
          uVar23 = 0;
          auVar146 = ZEXT1664(auVar138);
          do {
            auVar161 = auVar146;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = uVar23;
            auVar138 = vpshufd_avx(auVar40,0x44);
            auVar66._16_16_ = auVar138;
            auVar66._0_16_ = auVar138;
            auVar156 = vorps_avx(auVar66,auVar2);
            auVar66 = vorps_avx(auVar66,auVar3);
            auVar138 = vorps_avx(auVar38,auVar106);
            auVar114._8_4_ = auVar66._24_4_;
            auVar114._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
            auVar114._12_4_ = auVar66._28_4_ ^ 0x80000000;
            auVar40 = vpcmpgtq_avx(auVar114,auVar138);
            auVar96._8_4_ = auVar66._8_4_;
            auVar163._8_4_ = auVar96._8_4_;
            auVar163._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
            auVar163._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar95 = vpcmpgtq_avx(auVar163,auVar39);
            auVar95 = vpackssdw_avx(auVar95,auVar40);
            auVar169._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar169._8_4_ = auVar156._24_4_;
            auVar169._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar169,auVar138);
            auVar170._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar170._8_4_ = auVar156._8_4_;
            auVar170._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar138 = vpcmpgtq_avx(auVar170,auVar37);
            auVar138 = vpackssdw_avx(auVar138,auVar114);
            auVar138 = vpackssdw_avx(auVar138 ^ auVar108,auVar95 ^ auVar108);
            auVar95 = vpmovsxwd_avx(auVar138);
            auVar138 = vpunpckhwd_avx(auVar138,auVar138);
            auVar166._16_16_ = auVar138;
            auVar166._0_16_ = auVar95;
            auVar166 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])(*pauVar13 + uVar23 * 4));
            auVar123._0_4_ = auVar166._0_4_ + auVar161._0_4_;
            auVar123._4_4_ = auVar166._4_4_ + auVar161._4_4_;
            auVar123._8_4_ = auVar166._8_4_ + auVar161._8_4_;
            auVar123._12_4_ = auVar166._12_4_ + auVar161._12_4_;
            auVar126._16_4_ = auVar166._16_4_ + auVar161._16_4_;
            auVar126._0_16_ = auVar123;
            auVar126._20_4_ = auVar166._20_4_ + auVar161._20_4_;
            auVar126._24_4_ = auVar166._24_4_ + auVar161._24_4_;
            auVar126._28_4_ = auVar166._28_4_ + auVar161._28_4_;
            uVar23 = uVar23 + 8;
            auVar146 = ZEXT3264(auVar126);
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar23);
          auVar138 = vorps_avx(auVar38,auVar106);
          auVar96._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
          auVar96._12_4_ = auVar66._12_4_ ^ 0x80000000;
          auVar138 = vpcmpgtq_avx(auVar96,auVar138);
          auVar39 = vpackssdw_avx(auVar138,auVar40);
          auVar138 = vorps_avx(auVar38,auVar106);
          auVar139._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
          auVar139._8_4_ = auVar156._8_4_;
          auVar139._12_4_ = auVar156._12_4_ ^ 0x80000000;
          auVar138 = vpcmpgtq_avx(auVar139,auVar138);
          auVar138 = vpackssdw_avx(auVar138,auVar114);
          auVar138 = vblendvps_avx(auVar161._0_16_,auVar123,auVar138 ^ auVar108);
          auVar39 = vblendvps_avx(auVar161._16_16_,auVar126._16_16_,auVar39 ^ auVar108);
          auVar138 = vhaddps_avx(auVar39,auVar138);
          auVar138 = vhaddps_avx(auVar138,auVar138);
          auVar138 = vhaddps_avx(auVar138,auVar138);
          fVar129 = auVar138._0_4_;
        }
        fVar129 = (1.0 / (float)(int)uVar15) * fVar129;
        auVar138 = vshufps_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),0);
        pauVar13 = pauVar16;
        if ((int)uVar15 < 8) {
          auVar156 = SUB6432(ZEXT864(0),0);
          uVar11 = 0;
        }
        else {
          auVar67._16_16_ = auVar138;
          auVar67._0_16_ = auVar138;
          auVar146 = ZEXT864(0);
          iVar8 = 7;
          do {
            auVar156 = vsubps_avx(*pauVar13,auVar67);
            auVar39 = vfmadd231ps_fma(auVar146._0_32_,auVar156,auVar156);
            auVar146 = ZEXT1664(auVar39);
            auVar156 = ZEXT1632(auVar39);
            pauVar13 = pauVar13 + 1;
            iVar8 = iVar8 + 8;
            uVar11 = uVar9;
          } while (iVar8 < (int)uVar15);
        }
        auVar39 = ZEXT816(0) << 0x40;
        uVar10 = uVar11 | 3;
        while ((int)uVar10 < (int)uVar15) {
          auVar37 = vsubps_avx(*(undefined1 (*) [16])*pauVar13,auVar138);
          auVar39 = vfmadd231ps_fma(auVar39,auVar37,auVar37);
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          uVar10 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        auVar41._0_4_ = auVar156._0_4_ + auVar156._16_4_;
        auVar41._4_4_ = auVar156._4_4_ + auVar156._20_4_;
        auVar41._8_4_ = auVar156._8_4_ + auVar156._24_4_;
        auVar41._12_4_ = auVar156._12_4_ + auVar156._28_4_;
        auVar37 = vshufpd_avx(auVar41,auVar41,1);
        auVar42._0_4_ = auVar37._0_4_ + auVar41._0_4_;
        auVar42._4_4_ = auVar37._4_4_ + auVar41._4_4_;
        auVar42._8_4_ = auVar37._8_4_ + auVar41._8_4_;
        auVar42._12_4_ = auVar37._12_4_ + auVar41._12_4_;
        auVar37 = vshufpd_avx(auVar39,auVar39,1);
        auVar97._0_4_ = auVar39._0_4_ + auVar37._0_4_;
        auVar97._4_4_ = auVar39._4_4_ + auVar37._4_4_;
        auVar97._8_4_ = auVar39._8_4_ + auVar37._8_4_;
        auVar97._12_4_ = auVar39._12_4_ + auVar37._12_4_;
        auVar39 = vhaddps_avx(auVar42,auVar42);
        auVar37 = vmovshdup_avx(auVar97);
        fVar130 = auVar39._0_4_ + auVar37._0_4_ + auVar97._0_4_;
        auVar39 = ZEXT416((uint)fVar130);
        if ((int)uVar11 < (int)uVar15) {
          uVar19 = CONCAT44(0,~uVar11 + uVar15);
          auVar39 = vblendps_avx(ZEXT416((uint)fVar130),_DAT_0060b0c0,0xe);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar19;
          auVar38 = vpshufd_avx(auVar43,0x44);
          auVar156._16_16_ = auVar138;
          auVar156._0_16_ = auVar138;
          auVar138 = vorps_avx(auVar38,auVar106);
          auVar37 = vorps_avx(auVar38,auVar106);
          uVar23 = 0;
          do {
            auVar96 = auVar39;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar23;
            auVar39 = vpshufd_avx(auVar44,0x44);
            auVar68._16_16_ = auVar39;
            auVar68._0_16_ = auVar39;
            auVar66 = vorps_avx(auVar68,auVar2);
            auVar166 = vorps_avx(auVar68,auVar3);
            auVar39 = vorps_avx(auVar38,auVar106);
            auVar115._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
            auVar115._8_4_ = auVar166._24_4_;
            auVar115._12_4_ = auVar166._28_4_ ^ 0x80000000;
            auVar40 = vpcmpgtq_avx(auVar115,auVar39);
            auVar176._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
            auVar98._8_4_ = auVar166._8_4_;
            auVar176._8_4_ = auVar98._8_4_;
            auVar176._12_4_ = auVar166._12_4_ ^ 0x80000000;
            auVar95 = vpcmpgtq_avx(auVar176,auVar138);
            auVar95 = vpackssdw_avx(auVar95,auVar40);
            auVar82._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
            auVar82._8_4_ = auVar66._24_4_;
            auVar82._12_4_ = auVar66._28_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar82,auVar39);
            auVar83._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
            auVar83._8_4_ = auVar66._8_4_;
            auVar83._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar39 = vpcmpgtq_avx(auVar83,auVar37);
            auVar39 = vpackssdw_avx(auVar39,auVar114);
            auVar39 = vpackssdw_avx(auVar39 ^ auVar108,auVar95 ^ auVar108);
            auVar95 = vpmovsxwd_avx(auVar39);
            auVar39 = vpunpckhwd_avx(auVar39,auVar39);
            auVar89._16_16_ = auVar39;
            auVar89._0_16_ = auVar95;
            auVar126 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(*pauVar13 + uVar23 * 4));
            auVar126 = vsubps_avx(auVar126,auVar156);
            auVar39 = vfmadd213ps_fma(auVar126,auVar126,ZEXT1632(auVar96));
            uVar23 = uVar23 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar23);
          auVar138 = vorps_avx(auVar38,auVar106);
          auVar98._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
          auVar98._12_4_ = auVar166._12_4_ ^ 0x80000000;
          auVar138 = vpcmpgtq_avx(auVar98,auVar138);
          auVar37 = vpackssdw_avx(auVar138,auVar40);
          auVar138 = vorps_avx(auVar38,auVar106);
          auVar116._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
          auVar116._8_4_ = auVar66._8_4_;
          auVar116._12_4_ = auVar66._12_4_ ^ 0x80000000;
          auVar138 = vpcmpgtq_avx(auVar116,auVar138);
          auVar138 = vpackssdw_avx(auVar138,auVar114);
          auVar138 = vblendvps_avx(auVar96,auVar39,auVar138 ^ auVar108);
          auVar39 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar37 ^ auVar108);
          auVar138 = vhaddps_avx(auVar39,auVar138);
          auVar138 = vhaddps_avx(auVar138,auVar138);
          auVar39 = vhaddps_avx(auVar138,auVar138);
        }
        auVar138 = vfmadd213ss_fma(auVar39,ZEXT416((uint)(1.0 / (float)(int)uVar15)),
                                   ZEXT416((uint)(this->super_GroupNorm).eps));
        auVar138 = vsqrtss_avx(auVar138,auVar138);
        fVar130 = 1.0 / auVar138._0_4_;
        fVar129 = fVar130 * -fVar129;
        if ((this->super_GroupNorm).affine == 0) {
          auVar138 = vshufps_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),0);
          auVar39 = vshufps_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),0);
          uVar11 = 0;
          if (7 < (int)uVar15) {
            auVar70._16_16_ = auVar138;
            auVar70._0_16_ = auVar138;
            auVar103._16_16_ = auVar39;
            auVar103._0_16_ = auVar39;
            iVar8 = 7;
            do {
              auVar37 = vfmadd132ps_fma(*pauVar16,auVar103,auVar70);
              *pauVar16 = ZEXT1632(auVar37);
              pauVar16 = pauVar16 + 1;
              iVar8 = iVar8 + 8;
              uVar11 = uVar9;
            } while (iVar8 < (int)uVar15);
          }
          uVar10 = uVar11 | 3;
          while ((int)uVar10 < (int)uVar15) {
            auVar37 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar16,auVar39,auVar138);
            *(undefined1 (*) [16])*pauVar16 = auVar37;
            pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
            uVar10 = uVar11 + 7;
            uVar11 = uVar11 + 4;
          }
          if ((int)uVar11 < (int)uVar15) {
            uVar19 = CONCAT44(0,~uVar11 + uVar15);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar19;
            auVar37 = vpshufd_avx(auVar45,0x44);
            auVar142._16_16_ = auVar138;
            auVar142._0_16_ = auVar138;
            auVar127._16_16_ = auVar39;
            auVar127._0_16_ = auVar39;
            auVar138 = vorps_avx(auVar37,auVar106);
            auVar39 = vorps_avx(auVar37,auVar106);
            uVar23 = 0;
            do {
              auVar46._8_8_ = 0;
              auVar46._0_8_ = uVar23;
              auVar38 = vpshufd_avx(auVar46,0x44);
              auVar71._16_16_ = auVar38;
              auVar71._0_16_ = auVar38;
              auVar156 = vorps_avx(auVar71,auVar2);
              auVar66 = vorps_avx(auVar71,auVar3);
              auVar38 = vorps_avx(auVar37,auVar106);
              auVar117._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
              auVar117._8_4_ = auVar66._24_4_;
              auVar117._12_4_ = auVar66._28_4_ ^ 0x80000000;
              auVar95 = vpcmpgtq_avx(auVar117,auVar38);
              auVar47._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
              auVar47._8_4_ = auVar66._8_4_;
              auVar47._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar47,auVar138);
              auVar95 = vpackssdw_avx(auVar40,auVar95);
              auVar118._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
              auVar118._8_4_ = auVar156._24_4_;
              auVar118._12_4_ = auVar156._28_4_ ^ 0x80000000;
              auVar38 = vpcmpgtq_avx(auVar118,auVar38);
              auVar84._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
              auVar84._8_4_ = auVar156._8_4_;
              auVar84._12_4_ = auVar156._12_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar84,auVar39);
              auVar38 = vpackssdw_avx(auVar40,auVar38);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar108,auVar95 ^ auVar108);
              auVar95 = vpmovsxwd_avx(auVar38);
              auVar38 = vpunpckhwd_avx(auVar38,auVar38);
              auVar72._16_16_ = auVar38;
              auVar72._0_16_ = auVar95;
              auVar156 = vmaskmovps_avx(auVar72,*(undefined1 (*) [32])(*pauVar16 + uVar23 * 4));
              auVar38 = vfmadd213ps_fma(auVar156,auVar142,auVar127);
              auVar156 = vmaskmovps_avx(auVar72,ZEXT1632(auVar38));
              *(undefined1 (*) [32])(*pauVar16 + uVar23 * 4) = auVar156;
              uVar23 = uVar23 + 8;
            } while ((uVar19 + 8 & 0x1fffffff8) != uVar23);
          }
        }
        else if (0 < (int)uVar6) {
          pfVar5 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar17 +
                            (long)(this->super_GroupNorm).gamma_data.data);
          puVar25 = (uint *)(lVar17 * (this->super_GroupNorm).beta_data.elemsize +
                            (long)(this->super_GroupNorm).beta_data.data);
          uVar11 = 0;
          do {
            fVar147 = *pfVar5 * fVar130;
            auVar37 = vfmadd213ss_fma(ZEXT416((uint)*pfVar5),ZEXT416((uint)fVar129),
                                      ZEXT416(*puVar25));
            auVar138 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
            auVar39 = vshufps_avx(auVar37,auVar37,0);
            if ((int)uVar7 < 8) {
              uVar10 = 0;
            }
            else {
              auVar69._16_16_ = auVar138;
              auVar69._0_16_ = auVar138;
              auVar102._16_16_ = auVar39;
              auVar102._0_16_ = auVar39;
              iVar8 = 7;
              do {
                auVar38 = vfmadd132ps_fma(*pauVar16,auVar102,auVar69);
                *pauVar16 = ZEXT1632(auVar38);
                pauVar16 = pauVar16 + 1;
                iVar8 = iVar8 + 8;
                uVar10 = uVar7 & 0xfffffff8;
              } while (iVar8 < (int)uVar7);
            }
            uVar21 = uVar10 | 3;
            while ((int)uVar21 < (int)uVar7) {
              auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar16,auVar39,auVar138);
              *(undefined1 (*) [16])*pauVar16 = auVar38;
              pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
              uVar21 = uVar10 + 7;
              uVar10 = uVar10 + 4;
            }
            iVar8 = uVar7 - uVar10;
            if (iVar8 != 0 && (int)uVar10 <= (int)uVar7) {
              do {
                auVar138 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar16),auVar37,
                                           ZEXT416((uint)fVar147));
                *(int *)*pauVar16 = auVar138._0_4_;
                pauVar16 = (undefined1 (*) [32])(*pauVar16 + 4);
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
            pfVar5 = pfVar5 + 1;
            puVar25 = puVar25 + 1;
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar6);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (this->super_GroupNorm).group);
    }
  }
  else if (iVar8 == 1) {
    if (0 < (this->super_GroupNorm).group) {
      uVar7 = uVar6 & 0xfffffff8;
      lVar14 = 0;
      auVar105._8_8_ = 0x8000000000000000;
      auVar105._0_8_ = 0x8000000000000000;
      auVar108 = vpcmpeqd_avx(auVar108,auVar108);
      do {
        lVar17 = lVar14 * (int)uVar6;
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar17 + (long)bottom_top_blob->data);
        fVar129 = 0.0;
        fVar130 = 0.0;
        fVar121 = 0.0;
        fVar128 = 0.0;
        fVar131 = 0.0;
        fVar132 = 0.0;
        fVar133 = 0.0;
        fVar134 = 0.0;
        pauVar13 = pauVar16;
        uVar15 = 0;
        fVar147 = 0.0;
        fVar148 = 0.0;
        fVar149 = 0.0;
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar152 = 0.0;
        fVar153 = 0.0;
        fVar135 = 0.0;
        if (7 < (int)uVar6) {
          iVar8 = 7;
          do {
            fVar121 = fVar121 + *(float *)*pauVar13;
            fVar128 = fVar128 + *(float *)(*pauVar13 + 4);
            fVar129 = fVar129 + *(float *)(*pauVar13 + 8);
            fVar130 = fVar130 + *(float *)(*pauVar13 + 0xc);
            fVar131 = fVar131 + *(float *)(*pauVar13 + 0x10);
            fVar132 = fVar132 + *(float *)(*pauVar13 + 0x14);
            fVar133 = fVar133 + *(float *)(*pauVar13 + 0x18);
            fVar134 = fVar134 + *(float *)(*pauVar13 + 0x1c);
            pauVar13 = pauVar13 + 1;
            iVar8 = iVar8 + 8;
            uVar15 = uVar7;
            fVar147 = fVar121;
            fVar148 = fVar128;
            fVar149 = fVar129;
            fVar150 = fVar130;
            fVar151 = fVar131;
            fVar152 = fVar132;
            fVar153 = fVar133;
            fVar135 = fVar134;
          } while (iVar8 < (int)uVar6);
        }
        uVar9 = uVar15 | 3;
        auVar136 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar129 = auVar136._4_4_;
          fVar130 = auVar136._8_4_;
          fVar121 = auVar136._12_4_;
          if ((int)uVar6 <= (int)uVar9) break;
          auVar136._0_4_ = auVar136._0_4_ + *(float *)*pauVar13;
          auVar136._4_4_ = fVar129 + *(float *)(*pauVar13 + 4);
          auVar136._8_4_ = fVar130 + *(float *)(*pauVar13 + 8);
          auVar136._12_4_ = fVar121 + *(float *)(*pauVar13 + 0xc);
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          uVar9 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar26._0_4_ = fVar147 + fVar151;
        auVar26._4_4_ = fVar148 + fVar152;
        auVar26._8_4_ = fVar149 + fVar153;
        auVar26._12_4_ = fVar150 + fVar135;
        auVar106 = vshufpd_avx(auVar26,auVar26,1);
        auVar27._0_4_ = auVar106._0_4_ + auVar26._0_4_;
        auVar27._4_4_ = auVar106._4_4_ + auVar26._4_4_;
        auVar27._8_4_ = auVar106._8_4_ + auVar26._8_4_;
        auVar27._12_4_ = auVar106._12_4_ + auVar26._12_4_;
        auVar106 = vshufpd_avx(auVar136,auVar136,1);
        auVar91._0_4_ = auVar136._0_4_ + auVar106._0_4_;
        auVar91._4_4_ = fVar129 + auVar106._4_4_;
        auVar91._8_4_ = fVar130 + auVar106._8_4_;
        auVar91._12_4_ = fVar121 + auVar106._12_4_;
        auVar106 = vhaddps_avx(auVar27,auVar27);
        auVar138 = vmovshdup_avx(auVar91);
        fVar129 = auVar106._0_4_ + auVar138._0_4_ + auVar91._0_4_;
        if ((int)uVar15 < (int)uVar6) {
          uVar19 = CONCAT44(0,~uVar15 + uVar6);
          auVar106 = vblendps_avx(ZEXT416((uint)fVar129),_DAT_0060b0c0,0xe);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar19;
          auVar37 = vpshufd_avx(auVar28,0x44);
          auVar138 = vorps_avx(auVar37,auVar105);
          auVar39 = vorps_avx(auVar37,auVar105);
          uVar23 = 0;
          auVar146 = ZEXT1664(auVar106);
          do {
            auVar161 = auVar146;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar23;
            auVar106 = vpshufd_avx(auVar29,0x44);
            auVar61._16_16_ = auVar106;
            auVar61._0_16_ = auVar106;
            auVar156 = vorps_avx(auVar61,auVar2);
            auVar66 = vorps_avx(auVar61,auVar3);
            auVar106 = vorps_avx(auVar37,auVar105);
            auVar109._8_4_ = auVar66._24_4_;
            auVar109._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
            auVar109._12_4_ = auVar66._28_4_ ^ 0x80000000;
            auVar95 = vpcmpgtq_avx(auVar109,auVar106);
            auVar92._8_4_ = auVar66._8_4_;
            auVar162._8_4_ = auVar92._8_4_;
            auVar162._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
            auVar162._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar38 = vpcmpgtq_avx(auVar162,auVar138);
            auVar38 = vpackssdw_avx(auVar38,auVar95);
            auVar167._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar167._8_4_ = auVar156._24_4_;
            auVar167._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar40 = vpcmpgtq_avx(auVar167,auVar106);
            auVar168._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar168._8_4_ = auVar156._8_4_;
            auVar168._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar106 = vpcmpgtq_avx(auVar168,auVar39);
            auVar106 = vpackssdw_avx(auVar106,auVar40);
            auVar106 = vpackssdw_avx(auVar106 ^ auVar108,auVar38 ^ auVar108);
            auVar38 = vpmovsxwd_avx(auVar106);
            auVar106 = vpunpckhwd_avx(auVar106,auVar106);
            auVar164._16_16_ = auVar106;
            auVar164._0_16_ = auVar38;
            auVar166 = vmaskmovps_avx(auVar164,*(undefined1 (*) [32])(*pauVar13 + uVar23 * 4));
            auVar122._0_4_ = auVar166._0_4_ + auVar161._0_4_;
            auVar122._4_4_ = auVar166._4_4_ + auVar161._4_4_;
            auVar122._8_4_ = auVar166._8_4_ + auVar161._8_4_;
            auVar122._12_4_ = auVar166._12_4_ + auVar161._12_4_;
            auVar124._16_4_ = auVar166._16_4_ + auVar161._16_4_;
            auVar124._0_16_ = auVar122;
            auVar124._20_4_ = auVar166._20_4_ + auVar161._20_4_;
            auVar124._24_4_ = auVar166._24_4_ + auVar161._24_4_;
            auVar124._28_4_ = auVar166._28_4_ + auVar161._28_4_;
            uVar23 = uVar23 + 8;
            auVar146 = ZEXT3264(auVar124);
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar23);
          auVar106 = vorps_avx(auVar37,auVar105);
          auVar92._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
          auVar92._12_4_ = auVar66._12_4_ ^ 0x80000000;
          auVar106 = vpcmpgtq_avx(auVar92,auVar106);
          auVar138 = vpackssdw_avx(auVar106,auVar95);
          auVar106 = vorps_avx(auVar37,auVar105);
          auVar137._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
          auVar137._8_4_ = auVar156._8_4_;
          auVar137._12_4_ = auVar156._12_4_ ^ 0x80000000;
          auVar106 = vpcmpgtq_avx(auVar137,auVar106);
          auVar106 = vpackssdw_avx(auVar106,auVar40);
          auVar106 = vblendvps_avx(auVar161._0_16_,auVar122,auVar106 ^ auVar108);
          auVar138 = vblendvps_avx(auVar161._16_16_,auVar124._16_16_,auVar138 ^ auVar108);
          auVar106 = vhaddps_avx(auVar138,auVar106);
          auVar106 = vhaddps_avx(auVar106,auVar106);
          auVar106 = vhaddps_avx(auVar106,auVar106);
          fVar129 = auVar106._0_4_;
        }
        fVar129 = (1.0 / (float)(int)uVar6) * fVar129;
        auVar106 = vshufps_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),0);
        pauVar13 = pauVar16;
        if ((int)uVar6 < 8) {
          auVar156 = SUB6432(ZEXT864(0),0);
          uVar15 = 0;
        }
        else {
          auVar62._16_16_ = auVar106;
          auVar62._0_16_ = auVar106;
          auVar146 = ZEXT864(0);
          iVar8 = 7;
          do {
            auVar156 = vsubps_avx(*pauVar13,auVar62);
            auVar138 = vfmadd231ps_fma(auVar146._0_32_,auVar156,auVar156);
            auVar146 = ZEXT1664(auVar138);
            auVar156 = ZEXT1632(auVar138);
            pauVar13 = pauVar13 + 1;
            iVar8 = iVar8 + 8;
            uVar15 = uVar7;
          } while (iVar8 < (int)uVar6);
        }
        auVar138 = ZEXT816(0) << 0x40;
        uVar9 = uVar15 | 3;
        while ((int)uVar9 < (int)uVar6) {
          auVar39 = vsubps_avx(*(undefined1 (*) [16])*pauVar13,auVar106);
          auVar138 = vfmadd231ps_fma(auVar138,auVar39,auVar39);
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          uVar9 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar30._0_4_ = auVar156._0_4_ + auVar156._16_4_;
        auVar30._4_4_ = auVar156._4_4_ + auVar156._20_4_;
        auVar30._8_4_ = auVar156._8_4_ + auVar156._24_4_;
        auVar30._12_4_ = auVar156._12_4_ + auVar156._28_4_;
        auVar39 = vshufpd_avx(auVar30,auVar30,1);
        auVar31._0_4_ = auVar39._0_4_ + auVar30._0_4_;
        auVar31._4_4_ = auVar39._4_4_ + auVar30._4_4_;
        auVar31._8_4_ = auVar39._8_4_ + auVar30._8_4_;
        auVar31._12_4_ = auVar39._12_4_ + auVar30._12_4_;
        auVar39 = vshufpd_avx(auVar138,auVar138,1);
        auVar93._0_4_ = auVar138._0_4_ + auVar39._0_4_;
        auVar93._4_4_ = auVar138._4_4_ + auVar39._4_4_;
        auVar93._8_4_ = auVar138._8_4_ + auVar39._8_4_;
        auVar93._12_4_ = auVar138._12_4_ + auVar39._12_4_;
        auVar138 = vhaddps_avx(auVar31,auVar31);
        auVar39 = vmovshdup_avx(auVar93);
        fVar130 = auVar138._0_4_ + auVar39._0_4_ + auVar93._0_4_;
        auVar138 = ZEXT416((uint)fVar130);
        if ((int)uVar15 < (int)uVar6) {
          uVar19 = CONCAT44(0,~uVar15 + uVar6);
          auVar138 = vblendps_avx(ZEXT416((uint)fVar130),_DAT_0060b0c0,0xe);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar19;
          auVar37 = vpshufd_avx(auVar32,0x44);
          auVar155._16_16_ = auVar106;
          auVar155._0_16_ = auVar106;
          auVar106 = vorps_avx(auVar37,auVar105);
          auVar39 = vorps_avx(auVar37,auVar105);
          uVar23 = 0;
          do {
            auVar114 = auVar138;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar23;
            auVar138 = vpshufd_avx(auVar33,0x44);
            auVar63._16_16_ = auVar138;
            auVar63._0_16_ = auVar138;
            auVar156 = vorps_avx(auVar63,auVar2);
            auVar66 = vorps_avx(auVar63,auVar3);
            auVar138 = vorps_avx(auVar37,auVar105);
            auVar110._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
            auVar110._8_4_ = auVar66._24_4_;
            auVar110._12_4_ = auVar66._28_4_ ^ 0x80000000;
            auVar95 = vpcmpgtq_avx(auVar110,auVar138);
            auVar175._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
            auVar94._8_4_ = auVar66._8_4_;
            auVar175._8_4_ = auVar94._8_4_;
            auVar175._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar38 = vpcmpgtq_avx(auVar175,auVar106);
            auVar38 = vpackssdw_avx(auVar38,auVar95);
            auVar78._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar78._8_4_ = auVar156._24_4_;
            auVar78._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar40 = vpcmpgtq_avx(auVar78,auVar138);
            auVar79._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar79._8_4_ = auVar156._8_4_;
            auVar79._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar138 = vpcmpgtq_avx(auVar79,auVar39);
            auVar138 = vpackssdw_avx(auVar138,auVar40);
            auVar138 = vpackssdw_avx(auVar138 ^ auVar108,auVar38 ^ auVar108);
            auVar38 = vpmovsxwd_avx(auVar138);
            auVar138 = vpunpckhwd_avx(auVar138,auVar138);
            auVar88._16_16_ = auVar138;
            auVar88._0_16_ = auVar38;
            auVar166 = vmaskmovps_avx(auVar88,*(undefined1 (*) [32])(*pauVar13 + uVar23 * 4));
            auVar166 = vsubps_avx(auVar166,auVar155);
            auVar138 = vfmadd213ps_fma(auVar166,auVar166,ZEXT1632(auVar114));
            uVar23 = uVar23 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar23);
          auVar106 = vorps_avx(auVar37,auVar105);
          auVar94._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
          auVar94._12_4_ = auVar66._12_4_ ^ 0x80000000;
          auVar106 = vpcmpgtq_avx(auVar94,auVar106);
          auVar39 = vpackssdw_avx(auVar106,auVar95);
          auVar106 = vorps_avx(auVar37,auVar105);
          auVar111._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
          auVar111._8_4_ = auVar156._8_4_;
          auVar111._12_4_ = auVar156._12_4_ ^ 0x80000000;
          auVar106 = vpcmpgtq_avx(auVar111,auVar106);
          auVar106 = vpackssdw_avx(auVar106,auVar40);
          auVar106 = vblendvps_avx(auVar114,auVar138,auVar106 ^ auVar108);
          auVar138 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar39 ^ auVar108);
          in_ZMM1 = ZEXT1664(auVar138);
          auVar106 = vhaddps_avx(auVar138,auVar106);
          auVar106 = vhaddps_avx(auVar106,auVar106);
          auVar138 = vhaddps_avx(auVar106,auVar106);
        }
        auVar106 = vfmadd213ss_fma(auVar138,ZEXT416((uint)(1.0 / (float)(int)uVar6)),
                                   ZEXT416((uint)(this->super_GroupNorm).eps));
        auVar106 = vsqrtss_avx(auVar106,auVar106);
        fVar130 = 1.0 / auVar106._0_4_;
        auVar39 = ZEXT416((uint)fVar130);
        fVar130 = fVar130 * -fVar129;
        auVar106 = vshufps_avx(auVar39,auVar39,0);
        auVar160._16_16_ = auVar106;
        auVar160._0_16_ = auVar106;
        auVar138 = vshufps_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),0);
        auVar165._16_16_ = auVar138;
        auVar165._0_16_ = auVar138;
        if ((this->super_GroupNorm).affine == 0) {
          uVar15 = 0;
          if (7 < (int)uVar6) {
            iVar8 = 7;
            do {
              auVar39 = vfmadd132ps_fma(*pauVar16,auVar165,auVar160);
              *pauVar16 = ZEXT1632(auVar39);
              pauVar16 = pauVar16 + 1;
              iVar8 = iVar8 + 8;
              uVar15 = uVar7;
            } while (iVar8 < (int)uVar6);
          }
          uVar9 = uVar15 | 3;
          while ((int)uVar9 < (int)uVar6) {
            auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar16,auVar138,auVar106);
            *(undefined1 (*) [16])*pauVar16 = auVar39;
            pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
            uVar9 = uVar15 + 7;
            uVar15 = uVar15 + 4;
          }
          if ((int)uVar15 < (int)uVar6) {
            uVar19 = CONCAT44(0,~uVar15 + uVar6);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = uVar19;
            auVar39 = vpshufd_avx(auVar34,0x44);
            auVar125._16_16_ = auVar106;
            auVar125._0_16_ = auVar106;
            auVar141._16_16_ = auVar138;
            auVar141._0_16_ = auVar138;
            auVar106 = vorps_avx(auVar39,auVar105);
            auVar138 = vorps_avx(auVar39,auVar105);
            uVar23 = 0;
            do {
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar23;
              auVar37 = vpshufd_avx(auVar35,0x44);
              auVar64._16_16_ = auVar37;
              auVar64._0_16_ = auVar37;
              auVar156 = vorps_avx(auVar64,auVar2);
              auVar66 = vorps_avx(auVar64,auVar3);
              auVar37 = vorps_avx(auVar39,auVar105);
              auVar112._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
              auVar112._8_4_ = auVar66._24_4_;
              auVar112._12_4_ = auVar66._28_4_ ^ 0x80000000;
              auVar38 = vpcmpgtq_avx(auVar112,auVar37);
              auVar36._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
              auVar36._8_4_ = auVar66._8_4_;
              auVar36._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar95 = vpcmpgtq_avx(auVar36,auVar106);
              auVar38 = vpackssdw_avx(auVar95,auVar38);
              auVar113._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
              auVar113._8_4_ = auVar156._24_4_;
              auVar113._12_4_ = auVar156._28_4_ ^ 0x80000000;
              auVar37 = vpcmpgtq_avx(auVar113,auVar37);
              auVar81._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
              auVar81._8_4_ = auVar156._8_4_;
              auVar81._12_4_ = auVar156._12_4_ ^ 0x80000000;
              auVar95 = vpcmpgtq_avx(auVar81,auVar138);
              auVar37 = vpackssdw_avx(auVar95,auVar37);
              auVar37 = vpackssdw_avx(auVar37 ^ auVar108,auVar38 ^ auVar108);
              auVar38 = vpmovsxwd_avx(auVar37);
              auVar37 = vpunpckhwd_avx(auVar37,auVar37);
              auVar65._16_16_ = auVar37;
              auVar65._0_16_ = auVar38;
              auVar156 = vmaskmovps_avx(auVar65,*(undefined1 (*) [32])(*pauVar16 + uVar23 * 4));
              auVar37 = vfmadd213ps_fma(auVar156,auVar125,auVar141);
              in_ZMM1 = ZEXT1664(auVar37);
              auVar156 = vmaskmovps_avx(auVar65,ZEXT1632(auVar37));
              *(undefined1 (*) [32])(*pauVar16 + uVar23 * 4) = auVar156;
              uVar23 = uVar23 + 8;
            } while ((uVar19 + 8 & 0x1fffffff8) != uVar23);
          }
        }
        else {
          pauVar13 = (undefined1 (*) [32])
                     ((this->super_GroupNorm).gamma_data.elemsize * lVar17 +
                     (long)(this->super_GroupNorm).gamma_data.data);
          pauVar18 = (undefined1 (*) [32])
                     (lVar17 * (this->super_GroupNorm).beta_data.elemsize +
                     (long)(this->super_GroupNorm).beta_data.data);
          fVar129 = auVar106._0_4_;
          fVar147 = auVar106._4_4_;
          fVar148 = auVar106._8_4_;
          uVar15 = 0;
          if (7 < (int)uVar6) {
            iVar8 = 7;
            do {
              auVar156 = *pauVar13;
              auVar146._0_4_ = fVar129 * auVar156._0_4_;
              auVar146._4_4_ = fVar147 * auVar156._4_4_;
              auVar146._8_4_ = fVar148 * auVar156._8_4_;
              auVar146._12_4_ = auVar106._12_4_ * auVar156._12_4_;
              auVar146._16_4_ = fVar129 * auVar156._16_4_;
              auVar146._20_4_ = fVar147 * auVar156._20_4_;
              auVar146._28_36_ = in_ZMM1._28_36_;
              auVar146._24_4_ = fVar148 * auVar156._24_4_;
              in_ZMM1 = ZEXT3264(auVar146._0_32_);
              auVar37 = vfmadd213ps_fma(auVar156,auVar165,*pauVar18);
              auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar146._0_32_,*pauVar16);
              *pauVar16 = ZEXT1632(auVar37);
              pauVar13 = pauVar13 + 1;
              pauVar18 = pauVar18 + 1;
              pauVar16 = pauVar16 + 1;
              iVar8 = iVar8 + 8;
              uVar15 = uVar7;
            } while (iVar8 < (int)uVar6);
          }
          uVar9 = uVar15 | 3;
          while ((int)uVar9 < (int)uVar6) {
            auVar37 = *(undefined1 (*) [16])*pauVar13;
            auVar80._0_4_ = fVar129 * auVar37._0_4_;
            auVar80._4_4_ = fVar147 * auVar37._4_4_;
            auVar80._8_4_ = fVar148 * auVar37._8_4_;
            auVar80._12_4_ = auVar106._12_4_ * auVar37._12_4_;
            in_ZMM1 = ZEXT1664(auVar80);
            auVar37 = vfmadd213ps_fma(auVar37,auVar138,*(undefined1 (*) [16])*pauVar18);
            auVar37 = vfmadd231ps_fma(auVar37,auVar80,*(undefined1 (*) [16])*pauVar16);
            *(undefined1 (*) [16])*pauVar16 = auVar37;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
            pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
            uVar9 = uVar15 + 7;
            uVar15 = uVar15 + 4;
          }
          if ((int)uVar15 < (int)uVar6) {
            lVar17 = 0;
            do {
              auVar106 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar16 + lVar17 * 4)),
                                         ZEXT416((uint)fVar130),auVar39);
              auVar106 = vfmadd213ss_fma(auVar106,ZEXT416(*(uint *)(*pauVar13 + lVar17 * 4)),
                                         ZEXT416(*(uint *)(*pauVar18 + lVar17 * 4)));
              in_ZMM1 = ZEXT1664(auVar106);
              *(int *)(*pauVar16 + lVar17 * 4) = auVar106._0_4_;
              lVar17 = lVar17 + 1;
            } while (uVar6 - uVar15 != (int)lVar17);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (this->super_GroupNorm).group);
    }
  }
  else if ((iVar8 - 3U < 2) && (0 < (this->super_GroupNorm).group)) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar15 = uVar7 & 0xfffffff8;
    fVar129 = 1.0 / (float)(int)(uVar7 * uVar6);
    lVar14 = 0;
    auVar107._8_8_ = 0x8000000000000000;
    auVar107._0_8_ = 0x8000000000000000;
    auVar108 = vpcmpeqd_avx(auVar108,auVar108);
    do {
      lVar24 = lVar14 * (int)uVar6;
      uVar19 = bottom_top_blob->elemsize;
      lVar17 = bottom_top_blob->cstep * lVar24 * uVar19;
      pvVar1 = bottom_top_blob->data;
      uVar4 = ((long)bottom_top_blob->d * uVar19 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
              uVar19;
      auVar106 = ZEXT816(0) << 0x40;
      auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
      fVar130 = 0.0;
      if (0 < (int)uVar6) {
        uVar20 = 0;
        do {
          pfVar5 = (float *)((long)pvVar1 + uVar4 * uVar19 * uVar20 + lVar17);
          if ((int)uVar7 < 8) {
            fVar130 = 0.0;
            fVar147 = 0.0;
            fVar148 = 0.0;
            fVar149 = 0.0;
            fVar150 = 0.0;
            fVar151 = 0.0;
            fVar152 = 0.0;
            fVar153 = 0.0;
            uVar9 = 0;
          }
          else {
            fVar130 = 0.0;
            fVar147 = 0.0;
            fVar148 = 0.0;
            fVar149 = 0.0;
            fVar150 = 0.0;
            fVar151 = 0.0;
            fVar152 = 0.0;
            fVar153 = 0.0;
            iVar8 = 7;
            do {
              fVar130 = fVar130 + *pfVar5;
              fVar147 = fVar147 + pfVar5[1];
              fVar148 = fVar148 + pfVar5[2];
              fVar149 = fVar149 + pfVar5[3];
              fVar150 = fVar150 + pfVar5[4];
              fVar151 = fVar151 + pfVar5[5];
              fVar152 = fVar152 + pfVar5[6];
              fVar153 = fVar153 + pfVar5[7];
              pfVar5 = pfVar5 + 8;
              iVar8 = iVar8 + 8;
              uVar9 = uVar15;
            } while (iVar8 < (int)uVar7);
          }
          uVar11 = uVar9 | 3;
          auVar154 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar135 = auVar154._4_4_;
            fVar121 = auVar154._8_4_;
            fVar128 = auVar154._12_4_;
            if ((int)uVar7 <= (int)uVar11) break;
            auVar154._0_4_ = auVar154._0_4_ + *pfVar5;
            auVar154._4_4_ = fVar135 + pfVar5[1];
            auVar154._8_4_ = fVar121 + pfVar5[2];
            auVar154._12_4_ = fVar128 + pfVar5[3];
            pfVar5 = pfVar5 + 4;
            uVar11 = uVar9 + 7;
            uVar9 = uVar9 + 4;
          }
          auVar48._0_4_ = fVar130 + fVar150;
          auVar48._4_4_ = fVar147 + fVar151;
          auVar48._8_4_ = fVar148 + fVar152;
          auVar48._12_4_ = fVar149 + fVar153;
          auVar138 = vshufpd_avx(auVar48,auVar48,1);
          auVar49._0_4_ = auVar138._0_4_ + auVar48._0_4_;
          auVar49._4_4_ = auVar138._4_4_ + auVar48._4_4_;
          auVar49._8_4_ = auVar138._8_4_ + auVar48._8_4_;
          auVar49._12_4_ = auVar138._12_4_ + auVar48._12_4_;
          auVar138 = vmovshdup_avx(auVar49);
          auVar39 = vshufpd_avx(auVar154,auVar154,1);
          auVar119._0_4_ = auVar154._0_4_ + auVar39._0_4_;
          auVar119._4_4_ = fVar135 + auVar39._4_4_;
          auVar119._8_4_ = fVar121 + auVar39._8_4_;
          auVar119._12_4_ = fVar128 + auVar39._12_4_;
          auVar39 = vmovshdup_avx(auVar119);
          fVar130 = auVar39._0_4_ + auVar146._0_4_ + auVar138._0_4_ + auVar49._0_4_ + auVar119._0_4_
          ;
          auVar146 = ZEXT464((uint)fVar130);
          if ((int)uVar9 < (int)uVar7) {
            uVar12 = CONCAT44(0,~uVar9 + uVar7);
            auVar138 = vblendps_avx(ZEXT416((uint)fVar130),_DAT_0060b0c0,0xe);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar12;
            auVar38 = vpshufd_avx(auVar50,0x44);
            auVar39 = vorps_avx(auVar38,auVar107);
            auVar37 = vorps_avx(auVar38,auVar107);
            uVar22 = 0;
            auVar146 = ZEXT1664(auVar138);
            do {
              auVar161 = auVar146;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = uVar22;
              auVar138 = vpshufd_avx(auVar51,0x44);
              auVar73._16_16_ = auVar138;
              auVar73._0_16_ = auVar138;
              auVar156 = vorps_avx(auVar73,auVar2);
              auVar66 = vorps_avx(auVar73,auVar3);
              auVar138 = vorps_avx(auVar38,auVar107);
              auVar85._8_4_ = auVar66._24_4_;
              auVar85._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
              auVar85._12_4_ = auVar66._28_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar85,auVar138);
              auVar52._8_4_ = auVar66._8_4_;
              auVar171._8_4_ = auVar52._8_4_;
              auVar171._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
              auVar171._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar95 = vpcmpgtq_avx(auVar171,auVar39);
              auVar95 = vpackssdw_avx(auVar95,auVar40);
              auVar177._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
              auVar177._8_4_ = auVar156._24_4_;
              auVar177._12_4_ = auVar156._28_4_ ^ 0x80000000;
              auVar114 = vpcmpgtq_avx(auVar177,auVar138);
              auVar178._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
              auVar178._8_4_ = auVar156._8_4_;
              auVar178._12_4_ = auVar156._12_4_ ^ 0x80000000;
              auVar138 = vpcmpgtq_avx(auVar178,auVar37);
              auVar138 = vpackssdw_avx(auVar138,auVar114);
              auVar138 = vpackssdw_avx(auVar138 ^ auVar108,auVar95 ^ auVar108);
              auVar95 = vpmovsxwd_avx(auVar138);
              auVar138 = vpunpckhwd_avx(auVar138,auVar138);
              auVar174._16_16_ = auVar138;
              auVar174._0_16_ = auVar95;
              auVar166 = vmaskmovps_avx(auVar174,*(undefined1 (*) [32])(pfVar5 + uVar22));
              auVar140._0_4_ = auVar166._0_4_ + auVar161._0_4_;
              auVar140._4_4_ = auVar166._4_4_ + auVar161._4_4_;
              auVar140._8_4_ = auVar166._8_4_ + auVar161._8_4_;
              auVar140._12_4_ = auVar166._12_4_ + auVar161._12_4_;
              auVar143._16_4_ = auVar166._16_4_ + auVar161._16_4_;
              auVar143._0_16_ = auVar140;
              auVar143._20_4_ = auVar166._20_4_ + auVar161._20_4_;
              auVar143._24_4_ = auVar166._24_4_ + auVar161._24_4_;
              auVar143._28_4_ = auVar166._28_4_ + auVar161._28_4_;
              uVar22 = uVar22 + 8;
              auVar146 = ZEXT3264(auVar143);
            } while ((uVar12 + 8 & 0x1fffffff8) != uVar22);
            auVar138 = vorps_avx(auVar38,auVar107);
            auVar52._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
            auVar52._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar138 = vpcmpgtq_avx(auVar52,auVar138);
            auVar39 = vpackssdw_avx(auVar138,auVar40);
            auVar138 = vorps_avx(auVar38,auVar107);
            auVar144._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar144._8_4_ = auVar156._8_4_;
            auVar144._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar138 = vpcmpgtq_avx(auVar144,auVar138);
            auVar138 = vpackssdw_avx(auVar138,auVar114);
            auVar138 = vblendvps_avx(auVar161._0_16_,auVar140,auVar138 ^ auVar108);
            auVar39 = vblendvps_avx(auVar161._16_16_,auVar143._16_16_,auVar39 ^ auVar108);
            auVar138 = vhaddps_avx(auVar39,auVar138);
            auVar138 = vhaddps_avx(auVar138,auVar138);
            auVar138 = vhaddps_avx(auVar138,auVar138);
            auVar146 = ZEXT1664(auVar138);
          }
          fVar130 = auVar146._0_4_;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar23);
      }
      pfVar5 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar24 +
                        (long)(this->super_GroupNorm).gamma_data.data);
      puVar25 = (uint *)(lVar24 * (this->super_GroupNorm).beta_data.elemsize +
                        (long)(this->super_GroupNorm).beta_data.data);
      fVar130 = fVar130 * fVar129;
      if (0 < (int)uVar6) {
        auVar138 = vpermilps_avx(ZEXT416((uint)fVar130),0);
        auVar157._16_16_ = auVar138;
        auVar157._0_16_ = auVar138;
        auVar146 = ZEXT464(0) << 0x40;
        uVar20 = 0;
        do {
          pauVar16 = (undefined1 (*) [32])((long)pvVar1 + uVar4 * uVar19 * uVar20 + lVar17);
          if ((int)uVar7 < 8) {
            auVar156 = SUB6432(ZEXT864(0),0);
            uVar9 = 0;
          }
          else {
            auVar161 = ZEXT864(0);
            iVar8 = 7;
            do {
              auVar156 = vsubps_avx(*pauVar16,auVar157);
              auVar106 = vfmadd231ps_fma(auVar161._0_32_,auVar156,auVar156);
              auVar161 = ZEXT1664(auVar106);
              auVar156 = ZEXT1632(auVar106);
              pauVar16 = pauVar16 + 1;
              iVar8 = iVar8 + 8;
              uVar9 = uVar15;
            } while (iVar8 < (int)uVar7);
          }
          auVar106 = ZEXT816(0) << 0x40;
          uVar11 = uVar9 | 3;
          while ((int)uVar11 < (int)uVar7) {
            auVar39 = vsubps_avx(*(undefined1 (*) [16])*pauVar16,auVar138);
            auVar106 = vfmadd231ps_fma(auVar106,auVar39,auVar39);
            pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
            uVar11 = uVar9 + 7;
            uVar9 = uVar9 + 4;
          }
          auVar53._0_4_ = auVar156._0_4_ + auVar156._16_4_;
          auVar53._4_4_ = auVar156._4_4_ + auVar156._20_4_;
          auVar53._8_4_ = auVar156._8_4_ + auVar156._24_4_;
          auVar53._12_4_ = auVar156._12_4_ + auVar156._28_4_;
          auVar39 = vshufpd_avx(auVar53,auVar53,1);
          auVar54._0_4_ = auVar39._0_4_ + auVar53._0_4_;
          auVar54._4_4_ = auVar39._4_4_ + auVar53._4_4_;
          auVar54._8_4_ = auVar39._8_4_ + auVar53._8_4_;
          auVar54._12_4_ = auVar39._12_4_ + auVar53._12_4_;
          auVar39 = vmovshdup_avx(auVar54);
          auVar37 = vshufpd_avx(auVar106,auVar106,1);
          auVar120._0_4_ = auVar106._0_4_ + auVar37._0_4_;
          auVar120._4_4_ = auVar106._4_4_ + auVar37._4_4_;
          auVar120._8_4_ = auVar106._8_4_ + auVar37._8_4_;
          auVar120._12_4_ = auVar106._12_4_ + auVar37._12_4_;
          auVar106 = vmovshdup_avx(auVar120);
          fVar147 = auVar106._0_4_ + auVar146._0_4_ + auVar39._0_4_ + auVar54._0_4_ + auVar120._0_4_
          ;
          auVar146 = ZEXT464((uint)fVar147);
          if ((int)uVar9 < (int)uVar7) {
            uVar12 = CONCAT44(0,~uVar9 + uVar7);
            auVar106 = vblendps_avx(ZEXT416((uint)fVar147),_DAT_0060b0c0,0xe);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = uVar12;
            auVar38 = vpshufd_avx(auVar55,0x44);
            auVar39 = vorps_avx(auVar38,auVar107);
            auVar37 = vorps_avx(auVar38,auVar107);
            uVar22 = 0;
            do {
              auVar96 = auVar106;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = uVar22;
              auVar106 = vpshufd_avx(auVar56,0x44);
              auVar74._16_16_ = auVar106;
              auVar74._0_16_ = auVar106;
              auVar156 = vorps_avx(auVar74,auVar2);
              auVar66 = vorps_avx(auVar74,auVar3);
              auVar106 = vorps_avx(auVar38,auVar107);
              auVar86._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
              auVar86._8_4_ = auVar66._24_4_;
              auVar86._12_4_ = auVar66._28_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar86,auVar106);
              auVar159._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
              auVar57._8_4_ = auVar66._8_4_;
              auVar159._8_4_ = auVar57._8_4_;
              auVar159._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar95 = vpcmpgtq_avx(auVar159,auVar39);
              auVar95 = vpackssdw_avx(auVar95,auVar40);
              auVar99._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
              auVar99._8_4_ = auVar156._24_4_;
              auVar99._12_4_ = auVar156._28_4_ ^ 0x80000000;
              auVar114 = vpcmpgtq_avx(auVar99,auVar106);
              auVar100._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
              auVar100._8_4_ = auVar156._8_4_;
              auVar100._12_4_ = auVar156._12_4_ ^ 0x80000000;
              auVar106 = vpcmpgtq_avx(auVar100,auVar37);
              auVar106 = vpackssdw_avx(auVar106,auVar114);
              auVar106 = vpackssdw_avx(auVar106 ^ auVar108,auVar95 ^ auVar108);
              auVar95 = vpmovsxwd_avx(auVar106);
              auVar106 = vpunpckhwd_avx(auVar106,auVar106);
              auVar104._16_16_ = auVar106;
              auVar104._0_16_ = auVar95;
              auVar166 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(*pauVar16 + uVar22 * 4));
              auVar166 = vsubps_avx(auVar166,auVar157);
              auVar106 = vfmadd213ps_fma(auVar166,auVar166,ZEXT1632(auVar96));
              uVar22 = uVar22 + 8;
            } while ((uVar12 + 8 & 0x1fffffff8) != uVar22);
            auVar39 = vorps_avx(auVar38,auVar107);
            auVar57._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
            auVar57._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar39 = vpcmpgtq_avx(auVar57,auVar39);
            auVar37 = vpackssdw_avx(auVar39,auVar40);
            auVar39 = vorps_avx(auVar38,auVar107);
            auVar101._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar101._8_4_ = auVar156._8_4_;
            auVar101._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar39 = vpcmpgtq_avx(auVar101,auVar39);
            auVar39 = vpackssdw_avx(auVar39,auVar114);
            auVar106 = vblendvps_avx(auVar96,auVar106,auVar39 ^ auVar108);
            auVar39 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar37 ^ auVar108);
            auVar106 = vhaddps_avx(auVar39,auVar106);
            auVar106 = vhaddps_avx(auVar106,auVar106);
            auVar106 = vhaddps_avx(auVar106,auVar106);
            auVar146 = ZEXT1664(auVar106);
          }
          auVar106 = auVar146._0_16_;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar23);
      }
      if (0 < (int)uVar6) {
        auVar106 = vfmadd213ss_fma(auVar106,ZEXT416((uint)fVar129),
                                   ZEXT416((uint)(this->super_GroupNorm).eps));
        auVar106 = vsqrtss_avx(auVar106,auVar106);
        fVar147 = 1.0 / auVar106._0_4_;
        uVar20 = 0;
        do {
          auVar106 = ZEXT416((uint)(fVar147 * -fVar130));
          fVar148 = fVar147;
          if ((this->super_GroupNorm).affine != 0) {
            fVar148 = fVar147 * *pfVar5;
            auVar106 = vfmadd213ss_fma(ZEXT416((uint)*pfVar5),auVar106,ZEXT416(*puVar25));
          }
          pauVar16 = (undefined1 (*) [32])((long)pvVar1 + uVar4 * uVar19 * uVar20 + lVar17);
          auVar138 = vshufps_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),0);
          auVar106 = vshufps_avx(auVar106,auVar106,0);
          uVar9 = 0;
          if (7 < (int)uVar7) {
            auVar75._16_16_ = auVar138;
            auVar75._0_16_ = auVar138;
            auVar90._16_16_ = auVar106;
            auVar90._0_16_ = auVar106;
            iVar8 = 7;
            do {
              auVar39 = vfmadd132ps_fma(*pauVar16,auVar90,auVar75);
              *pauVar16 = ZEXT1632(auVar39);
              pauVar16 = pauVar16 + 1;
              iVar8 = iVar8 + 8;
              uVar9 = uVar15;
            } while (iVar8 < (int)uVar7);
          }
          uVar11 = uVar9 | 3;
          while ((int)uVar11 < (int)uVar7) {
            auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar16,auVar106,auVar138);
            *(undefined1 (*) [16])*pauVar16 = auVar39;
            pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
            uVar11 = uVar9 + 7;
            uVar9 = uVar9 + 4;
          }
          if ((int)uVar9 < (int)uVar7) {
            uVar12 = CONCAT44(0,~uVar9 + uVar7);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = uVar12;
            auVar39 = vpshufd_avx(auVar58,0x44);
            auVar158._16_16_ = auVar138;
            auVar158._0_16_ = auVar138;
            auVar145._16_16_ = auVar106;
            auVar145._0_16_ = auVar106;
            auVar106 = vorps_avx(auVar39,auVar107);
            auVar138 = vorps_avx(auVar39,auVar107);
            uVar22 = 0;
            do {
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar22;
              auVar37 = vpshufd_avx(auVar59,0x44);
              auVar76._16_16_ = auVar37;
              auVar76._0_16_ = auVar37;
              auVar156 = vorps_avx(auVar76,auVar2);
              auVar66 = vorps_avx(auVar76,auVar3);
              auVar37 = vorps_avx(auVar39,auVar107);
              auVar172._0_8_ = auVar66._16_8_ ^ 0x8000000000000000;
              auVar172._8_4_ = auVar66._24_4_;
              auVar172._12_4_ = auVar66._28_4_ ^ 0x80000000;
              auVar38 = vpcmpgtq_avx(auVar172,auVar37);
              auVar60._0_8_ = auVar66._0_8_ ^ 0x8000000000000000;
              auVar60._8_4_ = auVar66._8_4_;
              auVar60._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar95 = vpcmpgtq_avx(auVar60,auVar106);
              auVar38 = vpackssdw_avx(auVar95,auVar38);
              auVar173._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
              auVar173._8_4_ = auVar156._24_4_;
              auVar173._12_4_ = auVar156._28_4_ ^ 0x80000000;
              auVar37 = vpcmpgtq_avx(auVar173,auVar37);
              auVar87._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
              auVar87._8_4_ = auVar156._8_4_;
              auVar87._12_4_ = auVar156._12_4_ ^ 0x80000000;
              auVar95 = vpcmpgtq_avx(auVar87,auVar138);
              auVar37 = vpackssdw_avx(auVar95,auVar37);
              auVar37 = vpackssdw_avx(auVar37 ^ auVar108,auVar38 ^ auVar108);
              auVar38 = vpmovsxwd_avx(auVar37);
              auVar37 = vpunpckhwd_avx(auVar37,auVar37);
              auVar77._16_16_ = auVar37;
              auVar77._0_16_ = auVar38;
              auVar156 = vmaskmovps_avx(auVar77,*(undefined1 (*) [32])(*pauVar16 + uVar22 * 4));
              auVar37 = vfmadd213ps_fma(auVar156,auVar158,auVar145);
              auVar156 = vmaskmovps_avx(auVar77,ZEXT1632(auVar37));
              *(undefined1 (*) [32])(*pauVar16 + uVar22 * 4) = auVar156;
              uVar22 = uVar22 + 8;
            } while ((uVar12 + 8 & 0x1fffffff8) != uVar22);
          }
          pfVar5 = pfVar5 + 1;
          puVar25 = puVar25 + 1;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar23);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->super_GroupNorm).group);
  }
  return 0;
}

Assistant:

int GroupNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}